

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool google::ParseCallOffset(State *state)

{
  bool bVar1;
  undefined1 local_48 [8];
  State copy;
  State *state_local;
  
  copy._40_8_ = state;
  memcpy(local_48,state,0x30);
  bVar1 = ParseOneCharToken((State *)copy._40_8_,'h');
  if (((bVar1) && (bVar1 = ParseNVOffset((State *)copy._40_8_), bVar1)) &&
     (bVar1 = ParseOneCharToken((State *)copy._40_8_,'_'), bVar1)) {
    state_local._7_1_ = true;
  }
  else {
    memcpy((void *)copy._40_8_,local_48,0x30);
    bVar1 = ParseOneCharToken((State *)copy._40_8_,'v');
    if (((bVar1) && (bVar1 = ParseVOffset((State *)copy._40_8_), bVar1)) &&
       (bVar1 = ParseOneCharToken((State *)copy._40_8_,'_'), bVar1)) {
      state_local._7_1_ = true;
    }
    else {
      memcpy((void *)copy._40_8_,local_48,0x30);
      state_local._7_1_ = false;
    }
  }
  return state_local._7_1_;
}

Assistant:

static bool ParseCallOffset(State *state) {
  State copy = *state;
  if (ParseOneCharToken(state, 'h') &&
      ParseNVOffset(state) && ParseOneCharToken(state, '_')) {
    return true;
  }
  *state = copy;

  if (ParseOneCharToken(state, 'v') &&
      ParseVOffset(state) && ParseOneCharToken(state, '_')) {
    return true;
  }
  *state = copy;

  return false;
}